

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::json_abi_v3_11_3::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
::json_value::json_value(json_value *this,value_t t)

{
  byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *pbVar1;
  undefined3 in_register_00000031;
  
  switch(CONCAT31(in_register_00000031,t)) {
  default:
    *(undefined8 *)this = 0;
    return;
  case 1:
    pbVar1 = (byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::
                create<std::map<std::__cxx11::string,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>>
                          ();
    break;
  case 2:
    pbVar1 = (byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::
                create<std::vector<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          ();
    break;
  case 3:
    pbVar1 = (byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::create<std::__cxx11::string,char_const(&)[1]>((char (*) [1])0x1156d3);
    break;
  case 4:
    *this = (json_value)0x0;
    return;
  case 8:
    pbVar1 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::
             create<nlohmann::json_abi_v3_11_3::byte_container_with_subtype<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       ();
  }
  *(byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> **)this
       = pbVar1;
  return;
}

Assistant:

json_value(value_t t)
{
switch (t)
{
case value_t::object:
{
object = create<object_t>();
break;
}

case value_t::array:
{
array = create<array_t>();
break;
}

case value_t::string:
{
string = create<string_t>("");
break;
}

case value_t::binary:
{
binary = create<binary_t>();
break;
}

case value_t::boolean:
{
boolean = static_cast<boolean_t>(false);
break;
}

case value_t::number_integer:
{
number_integer = static_cast<number_integer_t>(0);
break;
}

case value_t::number_unsigned:
{
number_unsigned = static_cast<number_unsigned_t>(0);
break;
}

case value_t::number_float:
{
number_float = static_cast<number_float_t>(0.0);
break;
}

case value_t::null:
{
object = nullptr;  // silence warning, see #821
break;
}

case value_t::discarded:
default:
{
object = nullptr;  // silence warning, see #821
if (JSON_HEDLEY_UNLIKELY(t == value_t::null))
{
JSON_THROW(other_error::create(500, "961c151d2e87f2686a955a9be24d316f1362bf21 3.11.3", nullptr)); // LCOV_EXCL_LINE
}
break;
}
}
}